

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::set_sequential_range
          (torrent *this,piece_index_t first_piece,piece_index_t last_piece)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  unique_lock<std::mutex> local_38;
  
  if ((this->super_torrent_hot_members).m_picker._M_t.
      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl ==
      (piece_picker *)0x0) {
    if ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      return;
    }
    uVar1 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
    if ((uVar1 >> 0x19 & 1) == 0) {
      return;
    }
    if ((uVar1 >> 0x1e & 1) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_38._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar2) + 0x438);
      local_38._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_38);
      local_38._M_owns = true;
      iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x20c);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
      if (iVar2 != 1) {
        return;
      }
    }
    need_picker(this);
  }
  iVar2 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_num_pieces;
  if (last_piece.m_val < iVar2 && first_piece.m_val < iVar2) {
    this->field_0x5cc = this->field_0x5cc | 1;
    piece_picker::set_sequential_range
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
               first_piece,last_piece);
  }
  return;
}

Assistant:

void torrent::set_sequential_range(piece_index_t first_piece, piece_index_t last_piece)
	{
		if (!has_picker()) {
			if (!valid_metadata() || !m_connections_initialized) return;
			else if (!m_have_all
				|| settings().get_int(settings_pack::suggest_mode)
				== settings_pack::suggest_read_cache)
				need_picker();
			else return;
		}
		if (first_piece > m_torrent_file->last_piece() || last_piece > m_torrent_file->last_piece()) return;
		TORRENT_ASSERT_PRECOND(first_piece <= m_torrent_file->last_piece() && last_piece <= m_torrent_file->last_piece());
		m_sequential_download = true;
		m_picker->set_sequential_range(first_piece, last_piece);
	}